

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

double __thiscall CMU462::Matrix4x4::det(Matrix4x4 *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double *pdVar96;
  Matrix4x4 *A;
  Matrix4x4 *this_local;
  
  pdVar96 = operator()(this,0,3);
  dVar1 = *pdVar96;
  pdVar96 = operator()(this,1,2);
  dVar2 = *pdVar96;
  pdVar96 = operator()(this,2,1);
  dVar3 = *pdVar96;
  pdVar96 = operator()(this,3,0);
  dVar4 = *pdVar96;
  pdVar96 = operator()(this,0,2);
  dVar5 = *pdVar96;
  pdVar96 = operator()(this,1,3);
  dVar6 = *pdVar96;
  pdVar96 = operator()(this,2,1);
  dVar7 = *pdVar96;
  pdVar96 = operator()(this,3,0);
  dVar8 = *pdVar96;
  pdVar96 = operator()(this,0,3);
  dVar9 = *pdVar96;
  pdVar96 = operator()(this,1,1);
  dVar10 = *pdVar96;
  pdVar96 = operator()(this,2,2);
  dVar11 = *pdVar96;
  pdVar96 = operator()(this,3,0);
  dVar12 = *pdVar96;
  pdVar96 = operator()(this,0,1);
  dVar13 = *pdVar96;
  pdVar96 = operator()(this,1,3);
  dVar14 = *pdVar96;
  pdVar96 = operator()(this,2,2);
  dVar15 = *pdVar96;
  pdVar96 = operator()(this,3,0);
  dVar16 = *pdVar96;
  pdVar96 = operator()(this,0,2);
  dVar17 = *pdVar96;
  pdVar96 = operator()(this,1,1);
  dVar18 = *pdVar96;
  pdVar96 = operator()(this,2,3);
  dVar19 = *pdVar96;
  pdVar96 = operator()(this,3,0);
  dVar20 = *pdVar96;
  pdVar96 = operator()(this,0,1);
  dVar21 = *pdVar96;
  pdVar96 = operator()(this,1,2);
  dVar22 = *pdVar96;
  pdVar96 = operator()(this,2,3);
  dVar23 = *pdVar96;
  pdVar96 = operator()(this,3,0);
  dVar24 = *pdVar96;
  pdVar96 = operator()(this,0,3);
  dVar25 = *pdVar96;
  pdVar96 = operator()(this,1,2);
  dVar26 = *pdVar96;
  pdVar96 = operator()(this,2,0);
  dVar27 = *pdVar96;
  pdVar96 = operator()(this,3,1);
  dVar28 = *pdVar96;
  pdVar96 = operator()(this,0,2);
  dVar29 = *pdVar96;
  pdVar96 = operator()(this,1,3);
  dVar30 = *pdVar96;
  pdVar96 = operator()(this,2,0);
  dVar31 = *pdVar96;
  pdVar96 = operator()(this,3,1);
  dVar32 = *pdVar96;
  pdVar96 = operator()(this,0,3);
  dVar33 = *pdVar96;
  pdVar96 = operator()(this,1,0);
  dVar34 = *pdVar96;
  pdVar96 = operator()(this,2,2);
  dVar35 = *pdVar96;
  pdVar96 = operator()(this,3,1);
  dVar36 = *pdVar96;
  pdVar96 = operator()(this,0,0);
  dVar37 = *pdVar96;
  pdVar96 = operator()(this,1,3);
  dVar38 = *pdVar96;
  pdVar96 = operator()(this,2,2);
  dVar39 = *pdVar96;
  pdVar96 = operator()(this,3,1);
  dVar40 = *pdVar96;
  pdVar96 = operator()(this,0,2);
  dVar41 = *pdVar96;
  pdVar96 = operator()(this,1,0);
  dVar42 = *pdVar96;
  pdVar96 = operator()(this,2,3);
  dVar43 = *pdVar96;
  pdVar96 = operator()(this,3,1);
  dVar44 = *pdVar96;
  pdVar96 = operator()(this,0,0);
  dVar45 = *pdVar96;
  pdVar96 = operator()(this,1,2);
  dVar46 = *pdVar96;
  pdVar96 = operator()(this,2,3);
  dVar47 = *pdVar96;
  pdVar96 = operator()(this,3,1);
  dVar48 = *pdVar96;
  pdVar96 = operator()(this,0,3);
  dVar49 = *pdVar96;
  pdVar96 = operator()(this,1,1);
  dVar50 = *pdVar96;
  pdVar96 = operator()(this,2,0);
  dVar51 = *pdVar96;
  pdVar96 = operator()(this,3,2);
  dVar52 = *pdVar96;
  pdVar96 = operator()(this,0,1);
  dVar53 = *pdVar96;
  pdVar96 = operator()(this,1,3);
  dVar54 = *pdVar96;
  pdVar96 = operator()(this,2,0);
  dVar55 = *pdVar96;
  pdVar96 = operator()(this,3,2);
  dVar56 = *pdVar96;
  pdVar96 = operator()(this,0,3);
  dVar57 = *pdVar96;
  pdVar96 = operator()(this,1,0);
  dVar58 = *pdVar96;
  pdVar96 = operator()(this,2,1);
  dVar59 = *pdVar96;
  pdVar96 = operator()(this,3,2);
  dVar60 = *pdVar96;
  pdVar96 = operator()(this,0,0);
  dVar61 = *pdVar96;
  pdVar96 = operator()(this,1,3);
  dVar62 = *pdVar96;
  pdVar96 = operator()(this,2,1);
  dVar63 = *pdVar96;
  pdVar96 = operator()(this,3,2);
  dVar64 = *pdVar96;
  pdVar96 = operator()(this,0,1);
  dVar65 = *pdVar96;
  pdVar96 = operator()(this,1,0);
  dVar66 = *pdVar96;
  pdVar96 = operator()(this,2,3);
  dVar67 = *pdVar96;
  pdVar96 = operator()(this,3,2);
  dVar68 = *pdVar96;
  pdVar96 = operator()(this,0,0);
  dVar69 = *pdVar96;
  pdVar96 = operator()(this,1,1);
  dVar70 = *pdVar96;
  pdVar96 = operator()(this,2,3);
  dVar71 = *pdVar96;
  pdVar96 = operator()(this,3,2);
  dVar72 = *pdVar96;
  pdVar96 = operator()(this,0,2);
  dVar73 = *pdVar96;
  pdVar96 = operator()(this,1,1);
  dVar74 = *pdVar96;
  pdVar96 = operator()(this,2,0);
  dVar75 = *pdVar96;
  pdVar96 = operator()(this,3,3);
  dVar76 = *pdVar96;
  pdVar96 = operator()(this,0,1);
  dVar77 = *pdVar96;
  pdVar96 = operator()(this,1,2);
  dVar78 = *pdVar96;
  pdVar96 = operator()(this,2,0);
  dVar79 = *pdVar96;
  pdVar96 = operator()(this,3,3);
  dVar80 = *pdVar96;
  pdVar96 = operator()(this,0,2);
  dVar81 = *pdVar96;
  pdVar96 = operator()(this,1,0);
  dVar82 = *pdVar96;
  pdVar96 = operator()(this,2,1);
  dVar83 = *pdVar96;
  pdVar96 = operator()(this,3,3);
  dVar84 = *pdVar96;
  pdVar96 = operator()(this,0,0);
  dVar85 = *pdVar96;
  pdVar96 = operator()(this,1,2);
  dVar86 = *pdVar96;
  pdVar96 = operator()(this,2,1);
  dVar87 = *pdVar96;
  pdVar96 = operator()(this,3,3);
  dVar88 = *pdVar96;
  pdVar96 = operator()(this,0,1);
  dVar89 = *pdVar96;
  pdVar96 = operator()(this,1,0);
  dVar90 = *pdVar96;
  pdVar96 = operator()(this,2,2);
  dVar91 = *pdVar96;
  pdVar96 = operator()(this,3,3);
  dVar92 = *pdVar96;
  pdVar96 = operator()(this,0,0);
  dVar93 = *pdVar96;
  pdVar96 = operator()(this,1,1);
  dVar94 = *pdVar96;
  pdVar96 = operator()(this,2,2);
  dVar95 = *pdVar96;
  pdVar96 = operator()(this,3,3);
  return dVar93 * dVar94 * dVar95 * *pdVar96 +
         -(dVar89 * dVar90 * dVar91) * dVar92 +
         -(dVar85 * dVar86 * dVar87) * dVar88 +
         dVar81 * dVar82 * dVar83 * dVar84 +
         dVar77 * dVar78 * dVar79 * dVar80 +
         -(dVar73 * dVar74 * dVar75) * dVar76 +
         -(dVar69 * dVar70 * dVar71) * dVar72 +
         dVar65 * dVar66 * dVar67 * dVar68 +
         dVar61 * dVar62 * dVar63 * dVar64 +
         -(dVar57 * dVar58 * dVar59) * dVar60 +
         -(dVar53 * dVar54 * dVar55) * dVar56 +
         dVar49 * dVar50 * dVar51 * dVar52 +
         dVar45 * dVar46 * dVar47 * dVar48 +
         -(dVar41 * dVar42 * dVar43) * dVar44 +
         -(dVar37 * dVar38 * dVar39) * dVar40 +
         dVar33 * dVar34 * dVar35 * dVar36 +
         dVar29 * dVar30 * dVar31 * dVar32 +
         -(dVar25 * dVar26 * dVar27) * dVar28 +
         -(dVar21 * dVar22 * dVar23) * dVar24 +
         dVar17 * dVar18 * dVar19 * dVar20 +
         dVar13 * dVar14 * dVar15 * dVar16 +
         -(dVar9 * dVar10 * dVar11) * dVar12 +
         dVar1 * dVar2 * dVar3 * dVar4 + -(dVar5 * dVar6 * dVar7 * dVar8);
}

Assistant:

double Matrix4x4::det( void ) const {
    const Matrix4x4& A( *this );

	return
	  A(0,3)*A(1,2)*A(2,1)*A(3,0) - A(0,2)*A(1,3)*A(2,1)*A(3,0) -
	  A(0,3)*A(1,1)*A(2,2)*A(3,0) + A(0,1)*A(1,3)*A(2,2)*A(3,0) +
	  A(0,2)*A(1,1)*A(2,3)*A(3,0) - A(0,1)*A(1,2)*A(2,3)*A(3,0) -
	  A(0,3)*A(1,2)*A(2,0)*A(3,1) + A(0,2)*A(1,3)*A(2,0)*A(3,1) +
	  A(0,3)*A(1,0)*A(2,2)*A(3,1) - A(0,0)*A(1,3)*A(2,2)*A(3,1) -
	  A(0,2)*A(1,0)*A(2,3)*A(3,1) + A(0,0)*A(1,2)*A(2,3)*A(3,1) +
	  A(0,3)*A(1,1)*A(2,0)*A(3,2) - A(0,1)*A(1,3)*A(2,0)*A(3,2) -
	  A(0,3)*A(1,0)*A(2,1)*A(3,2) + A(0,0)*A(1,3)*A(2,1)*A(3,2) +
	  A(0,1)*A(1,0)*A(2,3)*A(3,2) - A(0,0)*A(1,1)*A(2,3)*A(3,2) -
	  A(0,2)*A(1,1)*A(2,0)*A(3,3) + A(0,1)*A(1,2)*A(2,0)*A(3,3) +
	  A(0,2)*A(1,0)*A(2,1)*A(3,3) - A(0,0)*A(1,2)*A(2,1)*A(3,3) -
	  A(0,1)*A(1,0)*A(2,2)*A(3,3) + A(0,0)*A(1,1)*A(2,2)*A(3,3);

  }